

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

void MULTILABEL::output_example(vw *all,example *ec)

{
  float fVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  float *pfVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  float fVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t i;
  int *piVar16;
  float fVar17;
  vw *all_00;
  undefined4 in_stack_fffffffffffffe10;
  int iVar18;
  string *psVar19;
  int *piVar20;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8;
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  lVar8 = (long)pwVar3 - (long)pwVar2;
  if (lVar8 == 0) {
    fVar17 = 0.0;
LAB_0020bc89:
    all_00 = all;
    shared_data::update(all->sd,ec->test_only,pwVar3 != pwVar2,fVar17,1.0,ec->num_features);
    piVar20 = (all->final_prediction_sink)._end;
    psVar19 = (string *)&ec->tag;
    for (piVar16 = (all->final_prediction_sink)._begin; piVar16 != piVar20; piVar16 = piVar16 + 1) {
      iVar18 = *piVar16;
      if (-1 < iVar18) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        for (uVar9 = 0;
            uVar9 < (ulong)((long)(ec->pred).scalars._end - (long)(ec->pred).scalars._begin >> 2);
            uVar9 = uVar9 + 1) {
          if (uVar9 != 0) {
            std::operator<<(&local_1a8,',');
          }
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        }
        std::operator<<(&local_1a8,' ');
        p_Var5 = all_00->print_text;
        std::__cxx11::stringbuf::str();
        vVar6._end._0_4_ = in_stack_fffffffffffffe10;
        vVar6._begin = (char *)all_00;
        vVar6._end._4_4_ = iVar18;
        vVar6.end_array = (char *)psVar19;
        vVar6.erase_count = (size_t)piVar20;
        (*p_Var5)(iVar18,*psVar19,vVar6);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
    }
    print_update(all_00,(ec->l).cs.costs._end == (ec->l).cs.costs._begin,ec);
    return;
  }
  pfVar4 = (ec->pred).scalars._begin;
  uVar10 = (long)(ec->pred).scalars._end - (long)pfVar4 >> 2;
  uVar9 = lVar8 >> 2;
  fVar17 = 0.0;
  uVar11 = 0;
  uVar13 = 0;
  do {
    uVar12 = (ulong)uVar11;
    while( true ) {
      uVar14 = (ulong)uVar13;
      uVar15 = uVar10 - uVar14;
      if ((uVar10 < uVar14 || uVar15 == 0) || (uVar9 <= uVar12)) {
        fVar17 = fVar17 + (float)(uVar9 - uVar12) + (float)uVar15;
        goto LAB_0020bc89;
      }
      fVar1 = pfVar4[uVar14];
      if ((uint)(&pwVar2->x)[uVar12] <= (uint)fVar1) break;
      uVar13 = uVar13 + 1;
      fVar17 = fVar17 + 1.0;
    }
    fVar7 = fVar17 + 1.0;
    if ((uint)fVar1 <= (uint)(&pwVar2->x)[uVar12]) {
      fVar7 = fVar17;
      uVar13 = uVar13 + 1;
    }
    fVar17 = fVar7;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void output_example(vw& all, example& ec)
{
  labels& ld = ec.l.multilabels;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    labels preds = ec.pred.multilabels;
    labels given = ec.l.multilabels;

    uint32_t preds_index = 0;
    uint32_t given_index = 0;

    while (preds_index < preds.label_v.size() && given_index < given.label_v.size())
    {
      if (preds.label_v[preds_index] < given.label_v[given_index])
      {
        preds_index++;
        loss++;
      }
      else if (preds.label_v[preds_index] > given.label_v[given_index])
      {
        given_index++;
        loss++;
      }
      else
      {
        preds_index++;
        given_index++;
      }
    }
    loss += given.label_v.size() - given_index;
    loss += preds.label_v.size() - preds_index;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (sink >= 0)
    {
      std::stringstream ss;

      for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      {
        if (i > 0)
          ss << ',';
        ss << ec.pred.multilabels.label_v[i];
      }
      ss << ' ';
      all.print_text(sink, ss.str(), ec.tag);
    }

  print_update(all, test_label(&ec.l.multilabels), ec);
}